

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

string * cmFileAPI::ComputeSuffixTime(string *__return_storage_ptr__,string *param_1)

{
  code cVar1;
  long lVar2;
  ostream *poVar3;
  _func_int *p_Var4;
  cmTimestamp cmts;
  ostringstream ss;
  cmTimestamp local_1ea;
  char local_1e9;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  lVar2 = std::chrono::_V2::system_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"%Y-%m-%dT%H-%M-%S","");
  cmTimestamp::CreateTimestampFromTimeT(&local_1c8,&local_1ea,lVar2 / 1000000000,&local_1e8,true);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  local_1e9 = '-';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e9,1);
  p_Var4 = (_func_int *)((long)&poVar3->_vptr_basic_ostream + (long)poVar3->_vptr_basic_ostream[-3])
  ;
  if ((&poVar3->field_0xe1)[(long)poVar3->_vptr_basic_ostream[-3]] == '\0') {
    cVar1 = (code)std::ios::widen((char)p_Var4);
    p_Var4[0xe0] = cVar1;
    p_Var4[0xe1] = (code)0x1;
  }
  p_Var4[0xe0] = (code)0x30;
  *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ComputeSuffixTime(std::string const&)
{
  std::chrono::milliseconds ms =
    std::chrono::duration_cast<std::chrono::milliseconds>(
      std::chrono::system_clock::now().time_since_epoch());
  std::chrono::seconds s =
    std::chrono::duration_cast<std::chrono::seconds>(ms);

  std::time_t ts = s.count();
  std::size_t tms = ms.count() % 1000;

  cmTimestamp cmts;
  std::ostringstream ss;
  ss << cmts.CreateTimestampFromTimeT(ts, "%Y-%m-%dT%H-%M-%S", true) << '-'
     << std::setfill('0') << std::setw(4) << tms;
  return ss.str();
}